

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecache.c
# Opt level: O3

_Bool duckdb_je_ecache_init
                (tsdn_t *tsdn,ecache_t *ecache,extent_state_t state,uint ind,_Bool delay_coalesce)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_malloc_mutex_init
                    (&ecache->mtx,"extents",WITNESS_RANK_EXTENTS,malloc_mutex_rank_exclusive);
  if (!_Var1) {
    ecache->state = state;
    ecache->ind = ind;
    ecache->delay_coalesce = delay_coalesce;
    duckdb_je_eset_init(&ecache->eset,state);
    duckdb_je_eset_init(&ecache->guarded_eset,state);
  }
  return _Var1;
}

Assistant:

bool
ecache_init(tsdn_t *tsdn, ecache_t *ecache, extent_state_t state, unsigned ind,
    bool delay_coalesce) {
	if (malloc_mutex_init(&ecache->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	ecache->state = state;
	ecache->ind = ind;
	ecache->delay_coalesce = delay_coalesce;
	eset_init(&ecache->eset, state);
	eset_init(&ecache->guarded_eset, state);

	return false;
}